

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_find_set.cpp
# Opt level: O0

void __thiscall si9ma::UnionFindSet::union_set(UnionFindSet *this,int val1,int val2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  mapped_type *pmVar4;
  int num2;
  int num1;
  int head2;
  int head1;
  int val2_local;
  int val1_local;
  UnionFindSet *this_local;
  
  head2 = val2;
  head1 = val1;
  _val2_local = this;
  num1 = find_header(this,val1);
  num2 = find_header(this,head2);
  pmVar4 = std::
           unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
           ::operator[](&this->rank_map,&num1);
  iVar1 = *pmVar4;
  pmVar4 = std::
           unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
           ::operator[](&this->rank_map,&num2);
  iVar3 = num1;
  iVar2 = num2;
  if (iVar1 < *pmVar4) {
    pmVar4 = std::
             unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
             ::operator[](&this->father_map,&num1);
    *pmVar4 = iVar2;
    pmVar4 = std::
             unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
             ::operator[](&this->rank_map,&num1);
    iVar1 = *pmVar4;
    pmVar4 = std::
             unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
             ::operator[](&this->rank_map,&num2);
    iVar2 = *pmVar4;
    pmVar4 = std::
             unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
             ::operator[](&this->rank_map,&num2);
    *pmVar4 = iVar1 + iVar2;
    std::
    unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::erase(&this->rank_map,&num1);
  }
  else {
    pmVar4 = std::
             unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
             ::operator[](&this->father_map,&num2);
    *pmVar4 = iVar3;
    pmVar4 = std::
             unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
             ::operator[](&this->rank_map,&num1);
    iVar1 = *pmVar4;
    pmVar4 = std::
             unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
             ::operator[](&this->rank_map,&num2);
    iVar2 = *pmVar4;
    pmVar4 = std::
             unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
             ::operator[](&this->rank_map,&num1);
    *pmVar4 = iVar1 + iVar2;
    std::
    unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::erase(&this->rank_map,&num2);
  }
  return;
}

Assistant:

void UnionFindSet::union_set(int val1, int val2) {
        int head1 = find_header(val1);
        int head2 = find_header(val2);

        int num1 = rank_map[head1];
        int num2 = rank_map[head2];

        if (num2 > num1){
            father_map[head1] = head2;
            rank_map[head2] = rank_map[head1] + rank_map[head2];
            rank_map.erase(head1);
        } else{
            father_map[head2] = head1;
            rank_map[head1] = rank_map[head1] + rank_map[head2];
            rank_map.erase(head2);
        }
    }